

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O1

void __thiscall wirehair::Codec::AddSubdiagonalValues(Codec *this)

{
  ulong uVar1;
  ushort uVar2;
  uint uVar3;
  PeelColumn *pPVar4;
  uint64_t *puVar5;
  bool bVar6;
  ushort uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ushort uVar11;
  int iVar12;
  uint uVar13;
  uint8_t *puVar14;
  int iVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar22;
  ulong uVar23;
  uint8_t *puVar24;
  ushort *puVar25;
  ulong uVar26;
  uint8_t *vy;
  uint8_t *win_table [128];
  uint local_4a0;
  uint8_t *local_430 [2];
  void *local_420;
  uint8_t *local_418;
  void *local_410;
  void *local_408;
  void *local_400;
  uint8_t *local_3f8 [8];
  uint8_t *local_3b8 [16];
  uint8_t *local_338 [32];
  uint8_t *local_238 [64];
  undefined8 uStack_38;
  ulong uVar21;
  
  uVar17 = (uint)this->_mix_count + (uint)this->_defer_count;
  uVar11 = this->_dense_count + this->_defer_count;
  uVar10 = 0;
  if (0x45 < uVar17) {
    iVar12 = -0x46;
    if (uVar17 >= 0x5b) {
      iVar12 = -0x5b;
    }
    iVar15 = -0x91;
    if (uVar17 < 0x91) {
      iVar15 = iVar12;
    }
    uVar9 = 7;
    if (uVar17 < 0x91) {
      uVar9 = 6 - (uVar17 < 0x5b);
    }
    uVar8 = 1;
    uVar13 = 1 << (uVar9 & 0x1f);
    uVar7 = this->_block_count;
    if (uVar7 != 0) {
      puVar14 = this->_recovery_blocks;
      pPVar4 = this->_peel_cols;
      uVar22 = this->_block_bytes;
      lVar16 = 0;
      do {
        if ((&pPVar4->Mark)[lVar16] == '\x01') {
          local_430[(ulong)uVar8 - 1] = puVar14;
          uVar8 = uVar8 + 1;
          if (uVar13 <= uVar8) break;
        }
        puVar14 = puVar14 + uVar22;
        lVar16 = lVar16 + 6;
      } while ((uint)uVar7 * 6 != (int)lVar16);
    }
    uVar10 = 0;
    if (uVar13 <= uVar8) {
      uVar7 = this->_extra_count + uVar11;
      local_4a0 = iVar15 + uVar17;
      uVar23 = 0;
      do {
        uVar8 = (uint)uVar23;
        uVar22 = (uVar8 - 1) + uVar9;
        uVar19 = (ulong)(uVar8 & 0x3f);
        uVar20 = (ulong)uVar22;
        if (uVar8 < uVar22) {
          uVar26 = 1L << uVar19;
          uVar10 = uVar23;
          do {
            uVar1 = uVar10 + 1;
            if (uVar10 < uVar20) {
              uVar2 = this->_ge_col_map[uVar10];
              uVar3 = this->_block_bytes;
              puVar14 = this->_recovery_blocks;
              puVar5 = this->_ge_matrix;
              uVar21 = uVar1;
              do {
                if ((*(ulong *)((long)puVar5 +
                               (ulong)((uint)this->_pivots[uVar21 & 0xffffffff] * this->_ge_pitch) *
                               8 + (ulong)(((uint)(uVar10 >> 6) & 0x3ffffff) << 3)) & uVar26) != 0)
                {
                  gf256_add_mem(this->_recovery_blocks +
                                (uint)this->_ge_col_map[uVar21 & 0xffffffff] * this->_block_bytes,
                                puVar14 + uVar2 * uVar3,this->_block_bytes);
                }
                uVar18 = (int)uVar21 + 1;
                uVar21 = (ulong)uVar18;
              } while (uVar18 <= uVar22);
            }
            uVar26 = uVar26 >> 0x3f | uVar26 << 1;
            uVar10 = uVar1;
          } while (uVar1 != uVar20);
        }
        uVar18 = uVar9 + uVar8;
        uVar10 = (ulong)uVar18;
        uVar3 = this->_block_bytes;
        puVar14 = this->_recovery_blocks + this->_ge_col_map[uVar23] * uVar3;
        puVar24 = this->_recovery_blocks + this->_ge_col_map[uVar8 + 1] * uVar3;
        local_430[0] = puVar14;
        local_430[1] = puVar24;
        gf256_addset_mem(local_420,puVar14,puVar24,uVar3);
        vy = this->_recovery_blocks + (uint)this->_ge_col_map[uVar8 + 2] * this->_block_bytes;
        local_418 = vy;
        gf256_addset_mem(local_410,puVar14,vy,this->_block_bytes);
        gf256_addset_mem(local_408,puVar24,vy,this->_block_bytes);
        gf256_addset_mem(local_400,puVar14,local_408,this->_block_bytes);
        uVar2 = this->_ge_col_map[uVar8 + 3];
        uVar3 = this->_block_bytes;
        puVar14 = this->_recovery_blocks;
        local_3f8[0] = puVar14 + uVar2 * uVar3;
        lVar16 = -7;
        do {
          gf256_addset_mem(local_3b8[lVar16],local_3f8[lVar16],puVar14 + uVar2 * uVar3,
                           this->_block_bytes);
          lVar16 = lVar16 + 1;
        } while (lVar16 != 0);
        if (4 < uVar9) {
          uVar2 = this->_ge_col_map[uVar8 + 4];
          uVar3 = this->_block_bytes;
          puVar14 = this->_recovery_blocks;
          local_3b8[0] = puVar14 + uVar2 * uVar3;
          lVar16 = -0xf;
          do {
            gf256_addset_mem(local_338[lVar16],local_3b8[lVar16],puVar14 + uVar2 * uVar3,
                             this->_block_bytes);
            lVar16 = lVar16 + 1;
          } while (lVar16 != 0);
          if (uVar9 != 5) {
            uVar2 = this->_ge_col_map[uVar8 + 5];
            uVar3 = this->_block_bytes;
            puVar14 = this->_recovery_blocks;
            local_338[0] = puVar14 + uVar2 * uVar3;
            lVar16 = -0x1f;
            do {
              gf256_addset_mem(local_238[lVar16],local_338[lVar16],puVar14 + uVar2 * uVar3,
                               this->_block_bytes);
              lVar16 = lVar16 + 1;
            } while (lVar16 != 0);
            if (6 < uVar9) {
              uVar2 = this->_ge_col_map[uVar8 + 6];
              uVar3 = this->_block_bytes;
              puVar14 = this->_recovery_blocks;
              local_238[0] = puVar14 + uVar2 * uVar3;
              lVar16 = -0x3f;
              do {
                gf256_addset_mem((void *)(&uStack_38)[lVar16],local_238[lVar16],
                                 puVar14 + uVar2 * uVar3,this->_block_bytes);
                lVar16 = lVar16 + 1;
              } while (lVar16 != 0);
            }
          }
        }
        uVar23 = uVar23 >> 6;
        puVar25 = this->_pivots + uVar20 + 1;
        if ((uint)uVar23 == uVar22 >> 6) {
          if (uVar18 < uVar17) {
            uVar20 = uVar10;
            do {
              if ((*puVar25 < uVar7) &&
                 (uVar8 = (uint)(this->_ge_matrix[uVar23 + (uint)*puVar25 * this->_ge_pitch] >>
                                uVar19) & uVar13 - 1, uVar8 != 0)) {
                gf256_add_mem(this->_recovery_blocks +
                              (uint)this->_ge_col_map[uVar20] * this->_block_bytes,
                              local_430[(ulong)uVar8 - 1],this->_block_bytes);
              }
              puVar25 = puVar25 + 1;
              uVar20 = uVar20 + 1;
            } while (uVar20 < uVar17);
          }
        }
        else if (uVar18 < uVar17) {
          uVar20 = uVar10;
          do {
            if ((*puVar25 < uVar7) &&
               (uVar26 = (ulong)((uint)*puVar25 * this->_ge_pitch),
               uVar22 = ((uint)(this->_ge_matrix[uVar23 + uVar26 + 1] <<
                               ((ulong)(0x40 - (uVar8 & 0x3f)) & 0x3f)) |
                        (uint)(this->_ge_matrix[uVar23 + uVar26] >> uVar19)) & uVar13 - 1,
               uVar22 != 0)) {
              gf256_add_mem(this->_recovery_blocks +
                            (uint)this->_ge_col_map[uVar20] * this->_block_bytes,
                            local_430[(ulong)uVar22 - 1],this->_block_bytes);
            }
            puVar25 = puVar25 + 1;
            uVar20 = uVar20 + 1;
          } while (uVar20 < uVar17);
        }
        bVar6 = true;
        if (local_4a0 <= uVar18) {
          uVar18 = uVar17 - uVar18;
          if (uVar18 < 0x5b) {
            if (uVar18 < 0x46) {
              if (uVar18 < 0x31) {
                bVar6 = false;
                goto LAB_0010556b;
              }
              uVar9 = 4;
              iVar12 = -0x31;
            }
            else {
              uVar9 = 5;
              iVar12 = -0x46;
            }
          }
          else {
            uVar9 = 6;
            iVar12 = -0x5b;
          }
          local_4a0 = uVar18 + iVar12;
          uVar13 = 1 << uVar9;
        }
LAB_0010556b:
        uVar23 = uVar10;
      } while (bVar6);
    }
  }
  uVar9 = (uint)uVar10 + 1;
  if (uVar9 < uVar17) {
    uVar23 = (ulong)uVar9;
    do {
      uVar7 = this->_ge_col_map[uVar23];
      uVar2 = this->_pivots[uVar23];
      uVar9 = this->_block_bytes;
      puVar14 = this->_recovery_blocks;
      uVar13 = (uint)uVar23;
      if (uVar2 < uVar11) {
LAB_00105002:
        if ((uint)uVar10 < uVar13) {
          uVar8 = this->_ge_pitch;
          puVar5 = this->_ge_matrix;
          uVar19 = 1L << (uVar10 & 0x3f);
          uVar20 = uVar10;
          do {
            if ((puVar5[(ulong)(uVar2 * uVar8) + (uVar20 >> 6 & 0x3ffffff)] & uVar19) != 0) {
              gf256_add_mem(puVar14 + uVar7 * uVar9,
                            this->_recovery_blocks +
                            (uint)this->_ge_col_map[uVar20] * this->_block_bytes,this->_block_bytes)
              ;
            }
            uVar19 = uVar19 >> 0x3f | uVar19 << 1;
            uVar20 = uVar20 + 1;
          } while (uVar13 != uVar20);
        }
      }
      else {
        uVar19 = (ulong)this->_first_heavy_column;
        if (uVar19 < uVar23) {
          uVar8 = this->_heavy_pitch;
          puVar24 = this->_heavy_matrix;
          do {
            if (puVar24[(ulong)((int)uVar19 - this->_first_heavy_column) +
                        (ulong)((ushort)(uVar2 - uVar11) * uVar8)] != '\0') {
              gf256_muladd_mem(puVar14 + uVar7 * uVar9,
                               puVar24[(ulong)((int)uVar19 - this->_first_heavy_column) +
                                       (ulong)((ushort)(uVar2 - uVar11) * uVar8)],
                               this->_recovery_blocks +
                               (uint)this->_ge_col_map[uVar19] * this->_block_bytes,
                               this->_block_bytes);
            }
            uVar19 = uVar19 + 1;
          } while ((uVar19 & 0xffffffff) != uVar23);
        }
        uVar8 = this->_first_heavy_column;
        if (uVar13 < this->_first_heavy_column) {
          uVar8 = uVar13;
        }
        uVar13 = uVar8;
        if ((ushort)(uVar2 - uVar11) < this->_extra_count) goto LAB_00105002;
      }
      uVar23 = uVar23 + 1;
    } while (uVar17 != (uint)uVar23);
  }
  return;
}

Assistant:

void Codec::AddSubdiagonalValues()
{
    CAT_IF_DUMP(cout << endl << "---- AddSubdiagonalValues ----" << endl << endl;)

    CAT_IF_ROWOP(uint32_t rowops = 0; unsigned heavyops = 0;)

    const unsigned column_count = _defer_count + _mix_count;
    unsigned pivot_i = 0;
    const uint16_t first_heavy_row = _defer_count + _dense_count;

#if defined(CAT_WINDOWED_LOWERTRI)
    const uint16_t first_non_binary_row = first_heavy_row + _extra_count;

    // Build temporary storage space if windowing is to be used
    if (column_count >= CAT_UNDER_WIN_THRESH_5)
    {
        unsigned w, next_check_i;

        // Calculate initial window size
        if (column_count >= CAT_UNDER_WIN_THRESH_7)
        {
            w = 7;
            next_check_i = column_count - CAT_UNDER_WIN_THRESH_7;
        }
        else if (column_count >= CAT_UNDER_WIN_THRESH_6)
        {
            w = 6;
            next_check_i = column_count - CAT_UNDER_WIN_THRESH_6;
        }
        else if (column_count >= CAT_UNDER_WIN_THRESH_5)
        {
            w = 5;
            next_check_i = column_count - CAT_UNDER_WIN_THRESH_5;
        }
        else
        {
            w = 4;
            next_check_i = CAT_UNDER_WIN_THRESH_4;
        }
        uint32_t win_lim = 1 << w;

        CAT_IF_DUMP(cout << "Activating windowed lower triangular elimination with initial window " << w << endl;)

        // Use the first few peel column values as window table space
        // Note that the peeled column values were previously used up until this point,
        // but now they are unused, and so they can be reused for temporary space
        uint8_t * GF256_RESTRICT win_table[128];
        const PeelColumn * GF256_RESTRICT column = _peel_cols;
        uint8_t * GF256_RESTRICT column_src = _recovery_blocks;
        uint32_t jj = 1;

        for (uint32_t count = _block_count; count > 0; --count, ++column, column_src += _block_bytes)
        {
            // If column is peeled:
            if (column->Mark == MARK_PEEL)
            {
                // Reuse the block value temporarily as window table space
                win_table[jj] = column_src;

                CAT_IF_DUMP(cout << "-- Window table entry " << jj << " set to column " << _block_count - count << endl;)

                // If done:
                if (++jj >= win_lim) {
                    break;
                }
            }
        }

        CAT_IF_DUMP(if (jj < win_lim) {
            cout << "!! Not enough space in peeled columns to generate a table.  " \
                "Going back to normal lower triangular elimination." << endl;
        })

        // If enough space was found:
        if (jj >= win_lim) for (;;)
        {
            // Calculate first column in window
            const unsigned final_i = pivot_i + w - 1;

            CAT_IF_DUMP(cout << "-- Windowing from " << pivot_i << " to " << final_i << " (inclusive)" << endl;)

            // Eliminate lower triangular part below windowed bits:

            uint64_t ge_mask = (uint64_t)1 << (pivot_i & 63);

            // For each column:
            for (unsigned src_pivot_i = pivot_i; src_pivot_i < final_i; ++src_pivot_i)
            {
                CAT_DEBUG_ASSERT(_ge_col_map[src_pivot_i] < _recovery_rows);
                uint8_t * GF256_RESTRICT src = _recovery_blocks + _block_bytes * _ge_col_map[src_pivot_i];

                CAT_IF_DUMP(cout << "Back-substituting small triangle from pivot " << src_pivot_i << "[" << (unsigned)src[0] << "] :";)

                const uint64_t * GF256_RESTRICT ge_row = _ge_matrix + (src_pivot_i >> 6);

                // For each row above the diagonal:
                for (unsigned dest_pivot_i = src_pivot_i + 1; dest_pivot_i <= final_i; ++dest_pivot_i)
                {
                    // If row is heavy:
                    const uint16_t dest_row_i = _pivots[dest_pivot_i];

                    // If bit is set in that row:
                    if (ge_row[_ge_pitch * dest_row_i] & ge_mask)
                    {
                        const uint16_t dest_col_i = _ge_col_map[dest_pivot_i];
                        CAT_DEBUG_ASSERT(dest_col_i < _block_count + _mix_count);

                        CAT_DEBUG_ASSERT(dest_col_i < _recovery_rows);
                        uint8_t * GF256_RESTRICT dest = _recovery_blocks + _block_bytes * dest_col_i;

                        // Back-substitute
                        gf256_add_mem(dest, src, _block_bytes);

                        CAT_IF_ROWOP(++rowops;)

                        CAT_IF_DUMP(cout << " " << dest_pivot_i;)
                    }
                } // next pivot above

                CAT_IF_DUMP(cout << endl;)

                ge_mask = CAT_ROL64(ge_mask, 1);
            } // next pivot

            CAT_IF_DUMP(cout << "-- Generating window table with " << w << " bits" << endl;)

            // Generate window table: 2 bits
            CAT_DEBUG_ASSERT(_ge_col_map[pivot_i] < _recovery_rows);
            win_table[1] = _recovery_blocks + _block_bytes * _ge_col_map[pivot_i];
            CAT_DEBUG_ASSERT(_ge_col_map[pivot_i + 1] < _recovery_rows);
            win_table[2] = _recovery_blocks + _block_bytes * _ge_col_map[pivot_i + 1];
            gf256_addset_mem(win_table[3], win_table[1], win_table[2], _block_bytes);
            CAT_IF_ROWOP(++rowops;)

            // Generate window table: 3 bits
            CAT_DEBUG_ASSERT(_ge_col_map[pivot_i + 2] < _recovery_rows);
            win_table[4] = _recovery_blocks + _block_bytes * _ge_col_map[pivot_i + 2];
            gf256_addset_mem(win_table[5], win_table[1], win_table[4], _block_bytes);
            gf256_addset_mem(win_table[6], win_table[2], win_table[4], _block_bytes);
            gf256_addset_mem(win_table[7], win_table[1], win_table[6], _block_bytes);
            CAT_IF_ROWOP(rowops += 3;)

            // Generate window table: 4 bits
            CAT_DEBUG_ASSERT(_ge_col_map[pivot_i + 3] < _recovery_rows);
            win_table[8] = _recovery_blocks + _block_bytes * _ge_col_map[pivot_i + 3];
            for (unsigned ii = 1; ii < 8; ++ii) {
                gf256_addset_mem(win_table[8 + ii], win_table[ii], win_table[8], _block_bytes);
            }
            CAT_IF_ROWOP(rowops += 7;)

            // Generate window table: 5+ bits
            if (w >= 5)
            {
                CAT_DEBUG_ASSERT(_ge_col_map[pivot_i + 4] < _recovery_rows);
                win_table[16] = _recovery_blocks + _block_bytes * _ge_col_map[pivot_i + 4];
                for (unsigned ii = 1; ii < 16; ++ii) {
                    gf256_addset_mem(win_table[16 + ii], win_table[ii], win_table[16], _block_bytes);
                }
                CAT_IF_ROWOP(rowops += 15;)

                if (w >= 6)
                {
                    CAT_DEBUG_ASSERT(_ge_col_map[pivot_i + 5] < _recovery_rows);
                    win_table[32] = _recovery_blocks + _block_bytes * _ge_col_map[pivot_i + 5];
                    for (unsigned ii = 1; ii < 32; ++ii) {
                        gf256_addset_mem(win_table[32 + ii], win_table[ii], win_table[32], _block_bytes);
                    }
                    CAT_IF_ROWOP(rowops += 31;)

                    if (w >= 7)
                    {
                        CAT_DEBUG_ASSERT(_ge_col_map[pivot_i + 6] < _recovery_rows);
                        win_table[64] = _recovery_blocks + _block_bytes * _ge_col_map[pivot_i + 6];
                        for (unsigned ii = 1; ii < 64; ++ii) {
                            gf256_addset_mem(win_table[64 + ii], win_table[ii], win_table[64], _block_bytes);
                        }
                        CAT_IF_ROWOP(rowops += 63;)
                    }
                }
            }

            const unsigned first_word = pivot_i >> 6;
            const unsigned shift0 = pivot_i & 63;
            const unsigned last_word = final_i >> 6;
            const uint16_t * GF256_RESTRICT pivot_row = _pivots + final_i + 1;

            // If not straddling words:
            if (first_word == last_word)
            {
                // For each pivot row:
                for (unsigned ge_below_i = final_i + 1; ge_below_i < column_count; ++ge_below_i)
                {
                    const uint16_t ge_row_i = *pivot_row++;

                    // If pivot row is heavy:
                    if (ge_row_i >= first_non_binary_row) {
                        continue;
                    }

                    // Calculate window bits
                    const uint64_t * GF256_RESTRICT ge_row = _ge_matrix + first_word + _ge_pitch * ge_row_i;
                    const unsigned win_bits = (uint32_t)(ge_row[0] >> shift0) & (win_lim - 1);

                    // If any XOR needs to be performed:
                    if (win_bits != 0)
                    {
                        CAT_IF_DUMP(cout << "Adding window table " << win_bits << " to pivot " << ge_below_i << endl;)

                        // Back-substitute
                        uint8_t * GF256_RESTRICT dest = _recovery_blocks + _block_bytes * _ge_col_map[ge_below_i];
                        gf256_add_mem(dest, win_table[win_bits], _block_bytes);
                        CAT_IF_ROWOP(++rowops;)
                    }
                }
            }
            else // Rare: Straddling case
            {
                const unsigned shift1 = 64 - shift0;

                // For each pivot row:
                for (unsigned ge_below_i = final_i + 1; ge_below_i < column_count; ++ge_below_i)
                {
                    // If pivot row is heavy:
                    const uint16_t ge_row_i = *pivot_row++;
                    if (ge_row_i >= first_non_binary_row) {
                        continue;
                    }

                    // Calculate window bits
                    const uint64_t * GF256_RESTRICT ge_row = _ge_matrix + first_word + _ge_pitch * ge_row_i;
                    const uint32_t win_bits = ( (uint32_t)(ge_row[0] >> shift0) | (uint32_t)(ge_row[1] << shift1) ) & (win_lim - 1);

                    // If any XOR needs to be performed:
                    if (win_bits != 0)
                    {
                        CAT_IF_DUMP(cout << "Adding window table " << win_bits << " to pivot " << ge_below_i << endl;)

                        // Back-substitute
                        uint8_t * GF256_RESTRICT dest = _recovery_blocks + _block_bytes * _ge_col_map[ge_below_i];
                        gf256_add_mem(dest, win_table[win_bits], _block_bytes);
                        CAT_IF_ROWOP(++rowops;)
                    }
                }
            }

            // If column index falls below window size:
            pivot_i += w;
            if (pivot_i >= next_check_i)
            {
                CAT_DEBUG_ASSERT(pivot_i < column_count);
                const unsigned remaining_columns = column_count - pivot_i;

                if (remaining_columns >= CAT_UNDER_WIN_THRESH_6) {
                    w = 6;
                    next_check_i = remaining_columns - CAT_UNDER_WIN_THRESH_6;
                }
                else if (remaining_columns >= CAT_UNDER_WIN_THRESH_5) {
                    w = 5;
                    next_check_i = remaining_columns - CAT_UNDER_WIN_THRESH_5;
                }
                else if (remaining_columns >= CAT_UNDER_WIN_THRESH_4) {
                    w = 4;
                    next_check_i = remaining_columns - CAT_UNDER_WIN_THRESH_4;
                }
                else {
                    break;
                }

                // Update window limit
                win_lim = 1 << w;
            }
        } // next window
    } // end if windowed
#endif // CAT_WINDOWED_LOWERTRI

    // For each row to eliminate:
    for (unsigned ge_column_i = pivot_i + 1; ge_column_i < column_count; ++ge_column_i)
    {
        // Lookup pivot column, GE row, and destination buffer
        const unsigned column_i = _ge_col_map[ge_column_i];
        const uint16_t ge_row_i = _pivots[ge_column_i];
        CAT_DEBUG_ASSERT(column_i < _recovery_rows);
        uint8_t * GF256_RESTRICT dest = _recovery_blocks + _block_bytes * column_i;

        CAT_IF_DUMP(cout << "Pivot " << ge_column_i << " solving column " << column_i << "[" << (unsigned)dest[0] << "] with GE row " << ge_row_i << " :";)

        unsigned ge_limit = ge_column_i;

        // If row is heavy or extra:
        if (ge_row_i >= first_heavy_row)
        {
            const uint16_t heavy_row_i = ge_row_i - first_heavy_row;

            // For each column up to the diagonal:
            const uint8_t * GF256_RESTRICT heavy_row = _heavy_matrix + _heavy_pitch * heavy_row_i;
            for (unsigned sub_i = _first_heavy_column; sub_i < ge_limit; ++sub_i)
            {
                // If column is zero:
                const uint8_t code_value = heavy_row[sub_i - _first_heavy_column];
                if (0 == code_value) {
                    continue; // Skip it
                }

                // Look up data source
                CAT_DEBUG_ASSERT(_ge_col_map[sub_i] < _recovery_rows);
                const uint8_t * GF256_RESTRICT src = _recovery_blocks + _block_bytes * _ge_col_map[sub_i];

                gf256_muladd_mem(dest, code_value, src, _block_bytes);

                CAT_IF_ROWOP(if (code_value == 1) ++rowops; else ++heavyops;)
                CAT_IF_DUMP(cout << " h" << ge_column_i << "=[" << (unsigned)src[0] << "*" << (unsigned)code_value << "]";)
            }

            // If row is not extra:
            if (heavy_row_i >= _extra_count) {
                CAT_IF_DUMP(cout << endl;)
                continue; // Skip binary matrix elimination
            }

            // Limit the binary matrix elimination to non-heavy columns
            if (ge_limit > _first_heavy_column) {
                ge_limit = _first_heavy_column;
            }

            // fall-thru..
        }

        const uint64_t * GF256_RESTRICT ge_row = _ge_matrix + _ge_pitch * ge_row_i;
        uint64_t ge_mask = (uint64_t)1 << (pivot_i & 63);

        // For each GE matrix bit in the row:
        for (unsigned bit_j = pivot_i; bit_j < ge_limit; ++bit_j)
        {
            // If bit is non-zero:
            if (0 != (ge_row[bit_j >> 6] & ge_mask))
            {
                const unsigned column_j = _ge_col_map[bit_j];
                CAT_DEBUG_ASSERT(column_j < _recovery_rows);
                const uint8_t * GF256_RESTRICT src = _recovery_blocks + _block_bytes * column_j;

                // Add pivot for non-zero bit to destination row value
                gf256_add_mem(dest, src, _block_bytes);
                CAT_IF_ROWOP(++rowops;)

                CAT_IF_DUMP(cout << " " << bit_j << "=[" << (unsigned)src[0] << "]";)
            }

            ge_mask = CAT_ROL64(ge_mask, 1);
        }

        CAT_IF_DUMP(cout << endl;)
    }

    CAT_IF_ROWOP(cout << "AddSubdiagonalValues used " << rowops << " row ops = " << rowops / (double)_block_count << "*N and " << heavyops << " heavy ops" << endl;)
}